

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O3

bool __thiscall ExternalTester::testAllWavelet(ExternalTester *this)

{
  TwoOneExpNX2 *f;
  long lVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  long lVar4;
  bool bVar5;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  __it;
  long lVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  int i_1;
  int *piVar9;
  int i;
  int iVar10;
  size_type __n;
  long lVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  int i_2;
  value_type_conflict1 *__val;
  double dVar17;
  vector<double,_std::allocator<double>_> v;
  vector<int,_std::allocator<int>_> indx;
  vector<int,_std::allocator<int>_> pntr;
  vector<double,_std::allocator<double>_> vals;
  vector<double,_std::allocator<double>_> pnts;
  TasmanianSparseGrid grid;
  vector<double,_std::allocator<double>_> local_168;
  long *local_148;
  long lStack_140;
  long local_138 [2];
  void **local_128;
  undefined8 uStack_120;
  long local_118;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  vector<double,_std::allocator<double>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  ExternalTester *local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  local_b0 [2];
  
  f = &this->f21nx2;
  bVar5 = testLocalWaveletRule
                    (this,&f->super_BaseFunction,(int *)&DAT_00142a30,(double *)&DAT_00142a60,true);
  if (bVar5) {
    bVar5 = testLocalWaveletRule
                      (this,&f->super_BaseFunction,(int *)&DAT_00142a30,(double *)&DAT_00142a60,
                       false);
    if (bVar5) {
      *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xb;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rules",5);
      *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wavelet",7);
      *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pass",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      bVar5 = true;
      goto LAB_0011b128;
    }
  }
  *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xb;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
  *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x22;
  local_108 = (void *)CONCAT44(local_108._4_4_,0x29);
  TasGrid::IO::getStringRuleMap_abi_cxx11_();
  p_Var2 = &local_b0[0]._M_impl.super__Rb_tree_header;
  __it._M_node = local_b0[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128 = &local_108;
  if ((_Rb_tree_header *)local_b0[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
              ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                            *)&local_128,__it);
      if (bVar5) break;
      __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
    } while ((_Rb_tree_header *)__it._M_node != p_Var2);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,*(long *)(__it._M_node + 1),
             (long)&(__it._M_node[1]._M_parent)->_M_color + *(long *)(__it._M_node + 1));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  ::~_Rb_tree(local_b0);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_148,lStack_140);
  *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"FAIL",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_148 != local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  bVar5 = false;
LAB_0011b128:
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)local_b0);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid
            ((int)(TasmanianSparseGrid *)local_b0,2,1,2,(int *)0x1);
  local_148 = (long *)0x0;
  lStack_140 = 0;
  local_138[0] = 0;
  local_118 = 0;
  local_128 = (void **)0x0;
  uStack_120 = 0;
  local_f8 = 0;
  local_108 = (void *)0x0;
  uStack_100 = 0;
  genRandom(&local_f0,10,2);
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
            ((vector *)local_b0,(vector *)&local_f0,(vector *)&local_128,(vector *)&local_148);
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getError(this,&f->super_BaseFunction,(TasmanianSparseGrid *)local_b0,type_internal_interpolation,
           &local_168);
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar6 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  puVar7 = (undefined8 *)operator_new(0x50);
  puVar7[8] = 0;
  puVar7[9] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  *puVar7 = 0;
  puVar7[1] = 0;
  local_b8 = this;
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)local_b0,
             (int)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  lVar11 = 0;
  iVar10 = *(int *)local_128;
  do {
    iVar3 = *(int *)((long)local_128 + (lVar11 + 1) * 4);
    if (iVar10 < iVar3) {
      dVar17 = (double)puVar7[lVar11];
      lVar12 = (long)iVar10;
      do {
        dVar17 = dVar17 - *(double *)(lVar6 + (long)*(int *)((long)local_148 + lVar12 * 4) * 8) *
                          *(double *)((long)local_108 + lVar12 * 8);
        puVar7[lVar11] = dVar17;
        lVar12 = lVar12 + 1;
      } while (iVar3 != lVar12);
    }
    lVar11 = lVar11 + 1;
    iVar10 = iVar3;
  } while (lVar11 != 10);
  lVar6 = 0;
  do {
    if (1e-12 < ABS((double)puVar7[lVar6])) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error in evaluateSparseHierarchicalFunctions() (wavelet)",
                 0x38);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      poVar8 = std::ostream::_M_insert<double>((double)puVar7[lVar6]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      bVar5 = false;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  if (local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
    __n = 0;
  }
  else {
    piVar9 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20);
    if (*(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x28) ==
        *(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x30)) {
      piVar9 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x48);
    }
    __n = (size_type)(*piVar9 * 10);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_168,__n,(allocator_type *)&local_d8);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getError(local_b8,&f->super_BaseFunction,(TasmanianSparseGrid *)local_b0,
           type_internal_interpolation,&local_d8);
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
            ((vector *)local_b0,(vector *)&local_f0);
  lVar6 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)local_b0,
             (int)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  lVar11 = 0;
  do {
    if (local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      lVar12 = *(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x28);
      lVar4 = *(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x30);
      puVar14 = (uint *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20);
      if (lVar12 == lVar4) {
        puVar14 = (uint *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x48);
      }
      uVar15 = (ulong)*puVar14;
      if (0 < (int)*puVar14) {
        lVar16 = 0;
        do {
          lVar13 = (int)uVar15 * (int)lVar11 + lVar16;
          lVar1 = lVar16 * 8;
          lVar16 = lVar16 + 1;
          puVar14 = (uint *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20);
          if (lVar12 == lVar4) {
            puVar14 = (uint *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x48);
          }
          puVar7[lVar11] =
               (double)puVar7[lVar11] -
               *(double *)(lVar6 + lVar1) *
               local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
          uVar15 = (ulong)(int)*puVar14;
        } while (lVar16 < (long)uVar15);
      }
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 10);
  lVar6 = 0;
  do {
    if (1e-12 < ABS((double)puVar7[lVar6])) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error in getHierarchicalCoefficients() (wavelet)",0x30);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      poVar8 = std::ostream::_M_insert<double>((double)puVar7[lVar6]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      bVar5 = false;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(puVar7,0x50);
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  if (local_128 != (void **)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  if (local_148 != (long *)0x0) {
    operator_delete(local_148,local_138[0] - (long)local_148);
  }
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_b0);
  return bVar5;
}

Assistant:

bool ExternalTester::testAllWavelet() const{
    bool pass = true;
    // Depths and tolerances for quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
    const int depths1[10] = { 7, 7, 7, 7, 7, // order 1
                              5, 5, 5, 5, 5 }; // order 3
    const double tols1[10] = { 5.E-05, 1.E-04, 1.E-04, 5E-02, 5E-02, // order 1
                               1.E-08, 1.E-07, 1.E-07, 5E-05, 5E-05 }; // order 3
    int wfirst = 11, wsecond = 34, wthird = 15;
    if (testLocalWaveletRule(&f21nx2, depths1, tols1, true) and testLocalWaveletRule(&f21nx2, depths1, tols1, false)){
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "wavelet" << setw(wthird) << "Pass" << endl;
    }else{
        cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(rule_wavelet) << setw(wthird) << "FAIL" << endl; pass = false;
    }{ TasGrid::TasmanianSparseGrid grid;
        grid.makeWaveletGrid(2, 1, 2, 1);
        std::vector<int> indx, pntr;
        std::vector<double> vals;
        std::vector<double> pnts = genRandom(10, 2);
        grid.evaluateSparseHierarchicalFunctions(pnts, pntr, indx, vals);
        getError(&f21nx2, grid, type_internal_interpolation); // this is done to load the values
        const double *coeff = grid.getHierarchicalCoefficients();
        std::vector<double> y(10);
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++){
                y[i] -= coeff[indx[j]] * vals[j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in evaluateSparseHierarchicalFunctions() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
        std::vector<double> v(10 * grid.getNumPoints());
        getError(&f21nx2, grid, type_internal_interpolation);
        grid.evaluateHierarchicalFunctions(pnts, v);
        coeff = grid.getHierarchicalCoefficients();
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=0; j<grid.getNumPoints(); j++){
                y[i] -= coeff[j] * v[i*grid.getNumPoints() + j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in getHierarchicalCoefficients() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
    }
    return pass;
}